

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::ClientWaitInvalidSyncTest::iterate(ClientWaitInvalidSyncTest *this)

{
  deBool dVar1;
  MessageBuilder *pMVar2;
  TestError *this_00;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_4d0;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  int local_1c0 [2];
  EGLint error;
  MessageBuilder local_1b0;
  int local_2c;
  TestLog *pTStack_28;
  EGLint status;
  TestLog *log;
  Library *egl;
  ClientWaitInvalidSyncTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  pTStack_28 = tcu::TestContext::getLog
                         ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
  local_2c = (**(code **)&log->m_log->isSessionOpen)
                       (log,(this->super_SyncTest).m_eglDisplay,0,0,0xffffffffffffffff);
  tcu::TestLog::operator<<(&local_1b0,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1b0,&local_2c);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [25])" = eglClientWaitSyncKHR(");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&(this->super_SyncTest).m_eglDisplay);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [39])", EGL_NO_SYNC_KHR, 0, EGL_FOREVER_KHR)");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  local_1c0[0] = (*(code *)log->m_log[6].lock)();
  tcu::TestLog::operator<<(&local_340,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_340,local_1c0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [17])" = eglGetError()");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_340);
  if (local_1c0[0] == 0x300c) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) || (local_2c != 0)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"status == EGL_FALSE",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x29f);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestLog::operator<<(&local_4c0,pTStack_28,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_4c0,(char (*) [19])"Unexpected error \'");
    EVar3 = eglu::getErrorStr(local_1c0[0]);
    local_4d0.m_getName = EVar3.m_getName;
    local_4d0.m_value = EVar3.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_4d0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [29])"\' expected EGL_BAD_PARAMETER");
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c0);
    tcu::TestContext::setTestResult
              ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Fail");
  }
  return STOP;
}

Assistant:

IterateResult	iterate						(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		EGLint status = egl.clientWaitSyncKHR(m_eglDisplay, EGL_NO_SYNC_KHR, 0, EGL_FOREVER_KHR);
		log << TestLog::Message << status << " = eglClientWaitSyncKHR(" << m_eglDisplay << ", EGL_NO_SYNC_KHR, 0, EGL_FOREVER_KHR)" << TestLog::EndMessage;

		EGLint error = egl.getError();
		log << TestLog::Message << error << " = eglGetError()" << TestLog::EndMessage;

		if (error != EGL_BAD_PARAMETER)
		{
			log << TestLog::Message << "Unexpected error '" << eglu::getErrorStr(error) << "' expected EGL_BAD_PARAMETER" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		TCU_CHECK(status == EGL_FALSE);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}